

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  uint uVar2;
  Wal *pWal;
  u32 *puVar3;
  _func_int_sqlite3_file_ptr *p_Var4;
  bool bVar5;
  Pager *pPVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  u32 uVar11;
  uint uVar12;
  long lVar13;
  uint *p;
  u32 uVar14;
  PgHdr **ppPVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  u32 uVar20;
  long lVar21;
  sqlite3_backup *p_00;
  long lVar22;
  PgHdr *pPVar23;
  PgHdr *pPVar24;
  bool bVar25;
  u32 salt1;
  WalWriter w;
  PgHdr *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  uint local_9c;
  undefined8 local_98;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  i64 local_80;
  Pager *local_78;
  PgHdr *local_70;
  sqlite3_file *local_68;
  uint *local_60;
  long local_58;
  WalWriter local_50;
  
  local_70 = pList;
  if (isCommit == 0) {
    iVar7 = 1;
  }
  else {
    iVar7 = 0;
    ppPVar15 = &local_70;
    do {
      if (pList->pgno <= nTruncate) {
        ppPVar15 = &pList->pDirty;
      }
      iVar7 = iVar7 + (uint)(pList->pgno <= nTruncate);
      pList = pList->pDirty;
      *ppPVar15 = pList;
    } while (pList != (PgHdr *)0x0);
  }
  pPVar23 = local_70;
  pPager->aStat[2] = pPager->aStat[2] + iVar7;
  if (local_70->pgno == 1) {
    pager_write_changecounter(local_70);
  }
  local_80 = pPager->pageSize;
  pWal = pPager->pWal;
  bVar1 = pPager->walSyncFlags;
  uVar8 = (uint)bVar1;
  puVar3 = *pWal->apWiData;
  iVar7 = bcmp(&pWal->hdr,puVar3,0x30);
  local_78 = pPager;
  if (iVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = puVar3[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar3[0x18] == 0) {
LAB_001496be:
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
      }
      pWal->readLock = -1;
      iVar10 = 1;
      do {
        iVar7 = walTryBeginRead(pWal,(int *)&local_a8,1,iVar10);
        iVar10 = iVar10 + 1;
      } while (iVar7 == -1);
    }
    else {
      sqlite3_randomness(4,&local_a8);
      if (pWal->exclusiveMode != '\0') {
LAB_00149393:
        walRestartHdr(pWal,(uint)local_a8);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_001496be;
      }
      iVar7 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if (iVar7 == 5) goto LAB_001496be;
      if (iVar7 == 0) goto LAB_00149393;
    }
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  uVar19 = (pWal->hdr).mxFrame;
  uVar18 = (ulong)uVar19;
  uVar20 = (u32)local_80;
  if (uVar18 == 0) {
    local_a8 = 0x18e22d0082067f37;
    local_a0 = (char)((ulong)local_80 >> 0x18);
    local_9f = (char)((ulong)local_80 >> 0x10);
    local_9e = (char)((ulong)local_80 >> 8);
    local_9d = (char)local_80;
    uVar12 = pWal->nCkpt;
    local_9c = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    if (uVar12 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_98 = *(undefined8 *)(pWal->hdr).aSalt;
    uVar11 = 0;
    uVar16 = 0xfffffffffffffff8;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + uVar11 + *(int *)(&local_a0 + uVar16);
      uVar11 = uVar11 + *(int *)((long)&local_9c + uVar16) + uVar14;
      uVar16 = uVar16 + 8;
    } while (uVar16 < 0x10);
    local_90 = (undefined1)(uVar14 >> 0x18);
    local_8f = (undefined1)(uVar14 >> 0x10);
    local_8e = (undefined1)(uVar14 >> 8);
    local_8d = (undefined1)uVar14;
    local_8c = (undefined1)(uVar11 >> 0x18);
    local_8b = (undefined1)(uVar11 >> 0x10);
    local_8a = (undefined1)(uVar11 >> 8);
    local_89 = (undefined1)uVar11;
    pWal->szPage = uVar20;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar14;
    (pWal->hdr).aFrameCksum[1] = uVar11;
    pWal->truncateOnCommit = '\x01';
    iVar7 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x20,0);
    if (iVar7 != 0) {
      return iVar7;
    }
    if (((pWal->syncHeader != '\0') && ((bVar1 >> 2 & 3) != 0)) &&
       (iVar7 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,bVar1 >> 2 & 3), iVar7 != 0)) {
      return iVar7;
    }
  }
  local_68 = pWal->pWalFd;
  local_50.iSyncPoint = 0;
  lVar13 = (long)(int)(uVar20 + 0x18);
  lVar22 = uVar18 * lVar13 + 0x20;
  iVar7 = 0;
  local_50.pWal = pWal;
  local_50.pFd = local_68;
  local_50.syncFlags = uVar8;
  local_50.szPage = uVar20;
  if (pPVar23 == (PgHdr *)0x0) {
    local_b0 = (PgHdr *)0x0;
  }
  else {
    local_b0 = (PgHdr *)0x0;
    pPVar24 = pPVar23;
    do {
      if (uVar9 == 0) {
LAB_001492bc:
        if (isCommit == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          if (pPVar24->pDirty == (PgHdr *)0x0) {
            uVar16 = (ulong)nTruncate;
          }
        }
LAB_001492d6:
        iVar10 = walWriteOneFrame(&local_50,(PgHdr *)pPVar24->pData,pPVar24->pgno,uVar16);
        if (iVar10 != 0) {
          return iVar10;
        }
        uVar18 = (ulong)((int)uVar18 + 1);
        lVar22 = lVar22 + lVar13;
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags | 0x40;
        local_b0 = pPVar24;
      }
      else {
        if ((isCommit != 0) && (uVar16 = (ulong)nTruncate, pPVar24->pDirty == (PgHdr *)0x0))
        goto LAB_001492d6;
        local_a8 = local_a8 & 0xffffffff00000000;
        sqlite3WalFindFrame(pWal,pPVar24->pgno,(u32 *)&local_a8);
        if ((uint)local_a8 < uVar9) goto LAB_001492bc;
        if ((uint)local_a8 <= pWal->iReCksum - 1) {
          pWal->iReCksum = (uint)local_a8;
        }
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)
                           (pWal->pWalFd,pPVar24->pData,(int)local_80,
                            (ulong)((uint)local_a8 - 1) * lVar13 + 0x38);
        if (iVar10 != 0) {
          return iVar10;
        }
        *(byte *)&pPVar24->flags = (byte)pPVar24->flags & 0xbf;
      }
      uVar19 = (uint)uVar18;
      pPVar24 = pPVar24->pDirty;
    } while (pPVar24 != (PgHdr *)0x0);
  }
  uVar9 = 0;
  if (isCommit == 0) goto LAB_0014980e;
  if (pWal->iReCksum != 0) {
    lVar21 = (long)(int)pWal->szPage + 0x18;
    iVar7 = (int)lVar21;
    p = (uint *)sqlite3_malloc(iVar7);
    if (p == (uint *)0x0) {
      return 7;
    }
    lVar17 = 0x18;
    if (pWal->iReCksum != 1) {
      lVar17 = (ulong)(pWal->iReCksum - 2) * lVar21 + 0x30;
    }
    iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar17);
    uVar9 = *p;
    (pWal->hdr).aFrameCksum[0] =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = p[1];
    (pWal->hdr).aFrameCksum[1] =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar9 = pWal->iReCksum;
    pWal->iReCksum = 0;
    if (uVar9 <= uVar19 && iVar10 == 0) {
      local_58 = (long)iVar7;
      local_60 = p + 6;
      do {
        lVar21 = (ulong)(uVar9 - 1) * local_58 + 0x20;
        iVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar7,lVar21);
        if (iVar10 != 0) {
          sqlite3_free(p);
          return iVar10;
        }
        uVar12 = *p;
        uVar2 = p[1];
        walEncodeFrame(pWal,uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                            uVar12 << 0x18,
                       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18,(u8 *)local_60,(u8 *)&local_a8);
        iVar10 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x18,lVar21);
      } while ((uVar9 + 1 <= uVar19) && (uVar9 = uVar9 + 1, iVar10 == 0));
    }
    sqlite3_free(p);
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  if ((bVar1 & 3) == 0) {
    iVar7 = 0;
    uVar9 = 0;
  }
  else {
    if (pWal->padToSectorBoundary == '\0') {
      uVar9 = 0;
    }
    else {
      p_Var4 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var4 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar18 = 0x1000;
      }
      else {
        uVar12 = (*p_Var4)(pWal->pWalFd);
        uVar9 = 0x10000;
        if (uVar12 < 0x10000) {
          uVar9 = uVar12;
        }
        uVar18 = 0x200;
        if (0x1f < (int)uVar12) {
          uVar18 = (ulong)uVar9;
        }
      }
      lVar21 = uVar18 + lVar22 + -1;
      lVar21 = lVar21 - lVar21 % (long)uVar18;
      iVar7 = 0;
      uVar9 = 0;
      local_50.iSyncPoint = lVar21;
      if (lVar22 < lVar21) {
        uVar9 = 0;
        lVar17 = lVar22;
        do {
          iVar10 = walWriteOneFrame(&local_50,(PgHdr *)local_b0->pData,local_b0->pgno,
                                    (ulong)nTruncate);
          if (iVar10 != 0) {
            return iVar10;
          }
          lVar17 = lVar17 + lVar13;
          uVar9 = uVar9 + 1;
        } while (lVar17 < lVar21);
      }
      if (lVar21 != lVar22) goto LAB_001497d7;
    }
    iVar7 = (*local_68->pMethods->xSync)(local_68,uVar8 & 3);
  }
LAB_001497d7:
  if ((pWal->truncateOnCommit != '\0') && (lVar22 = pWal->mxWalSize, -1 < lVar22)) {
    lVar13 = lVar13 * (ulong)(uVar19 + uVar9) + 0x20;
    if (lVar13 <= lVar22) {
      lVar13 = lVar22;
    }
    walLimitSize(pWal,lVar13);
    pWal->truncateOnCommit = '\0';
  }
LAB_0014980e:
  uVar20 = (pWal->hdr).mxFrame;
  pPVar24 = pPVar23;
  while ((pPVar24 != (PgHdr *)0x0 && (iVar7 == 0))) {
    iVar7 = 0;
    if ((pPVar24->flags & 0x40) != 0) {
      uVar20 = uVar20 + 1;
      iVar7 = walIndexAppend(pWal,uVar20,pPVar24->pgno);
    }
    pPVar24 = pPVar24->pDirty;
  }
  bVar25 = iVar7 == 0;
  if ((bVar25) && (0 < (int)uVar9)) {
    do {
      uVar20 = uVar20 + 1;
      iVar7 = walIndexAppend(pWal,uVar20,local_b0->pgno);
      bVar25 = iVar7 == 0;
      if (!bVar25) break;
      bVar5 = 1 < uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar5);
  }
  pPVar6 = local_78;
  if (bVar25) {
    (pWal->hdr).szPage = (ushort)((ulong)local_80 >> 0x10) | (ushort)local_80 & 0xff00;
    (pWal->hdr).mxFrame = uVar20;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar20;
    }
  }
  else if (iVar7 != 0) {
    return iVar7;
  }
  p_00 = pPVar6->pBackup;
  if (p_00 != (sqlite3_backup *)0x0 && pPVar23 != (PgHdr *)0x0) {
    while( true ) {
      if (p_00 != (sqlite3_backup *)0x0) {
        backupUpdate(p_00,pPVar23->pgno,(u8 *)pPVar23->pData);
      }
      pPVar23 = pPVar23->pDirty;
      if (pPVar23 == (PgHdr *)0x0) break;
      p_00 = pPVar6->pBackup;
    }
  }
  return 0;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal,
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}